

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallRuntimeDependencySetGenerator.cxx
# Opt level: O3

void __thiscall
cmInstallRuntimeDependencySetGenerator::GenerateAppleFrameworkScript
          (cmInstallRuntimeDependencySetGenerator *this,ostream *os,string *config,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *evaluatedRPaths,Indent indent)

{
  char *pcVar1;
  int iVar2;
  size_t sVar3;
  Indent IVar4;
  Indent IVar5;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_00;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_01;
  string depNameVar;
  string depName;
  undefined1 local_118 [40];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_f0;
  string local_e8;
  string local_c8;
  string local_a8;
  char *local_88;
  undefined8 local_80;
  undefined8 local_78;
  char *local_70;
  undefined8 local_68;
  size_t local_60;
  char *local_58;
  undefined8 local_50;
  undefined8 local_48;
  char *local_40;
  undefined8 local_38;
  
  IVar4.Level = indent.Level;
  if (0 < indent.Level) {
    do {
      std::__ostream_insert<char,std::char_traits<char>>(os," ",1);
      IVar4.Level = IVar4.Level + -1;
    } while (IVar4.Level != 0);
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,"if(",3);
  pcVar1 = this->TmpVarPrefix;
  iVar2 = (int)os;
  if (pcVar1 == (char *)0x0) {
    std::ios::clear(iVar2 + (int)os->_vptr_basic_ostream[-3]);
  }
  else {
    sVar3 = strlen(pcVar1);
    std::__ostream_insert<char,std::char_traits<char>>(os,pcVar1,sVar3);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            (os,"_dep MATCHES \"^(.*/)?([^/]*\\\\.framework)/(.*)$\")\n",0x31);
  IVar4.Level = indent.Level + 2;
  IVar5.Level = IVar4.Level;
  if (-2 < indent.Level) {
    do {
      std::__ostream_insert<char,std::char_traits<char>>(os," ",1);
      IVar5.Level = IVar5.Level + -1;
    } while (IVar5.Level != 0);
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,"set(",4);
  pcVar1 = this->TmpVarPrefix;
  if (pcVar1 == (char *)0x0) {
    std::ios::clear(iVar2 + (int)os->_vptr_basic_ostream[-3]);
  }
  else {
    sVar3 = strlen(pcVar1);
    std::__ostream_insert<char,std::char_traits<char>>(os,pcVar1,sVar3);
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,"_dir \"${CMAKE_MATCH_1}\")\n",0x19);
  IVar5.Level = IVar4.Level;
  if (-2 < indent.Level) {
    do {
      std::__ostream_insert<char,std::char_traits<char>>(os," ",1);
      IVar5.Level = IVar5.Level + -1;
    } while (IVar5.Level != 0);
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,"set(",4);
  pcVar1 = this->TmpVarPrefix;
  if (pcVar1 == (char *)0x0) {
    std::ios::clear(iVar2 + (int)os->_vptr_basic_ostream[-3]);
  }
  else {
    sVar3 = strlen(pcVar1);
    std::__ostream_insert<char,std::char_traits<char>>(os,pcVar1,sVar3);
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,"_name \"${CMAKE_MATCH_2}\")\n",0x1a);
  IVar5.Level = IVar4.Level;
  if (-2 < indent.Level) {
    do {
      std::__ostream_insert<char,std::char_traits<char>>(os," ",1);
      IVar5.Level = IVar5.Level + -1;
    } while (IVar5.Level != 0);
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,"set(",4);
  pcVar1 = this->TmpVarPrefix;
  if (pcVar1 == (char *)0x0) {
    std::ios::clear(iVar2 + (int)os->_vptr_basic_ostream[-3]);
  }
  else {
    sVar3 = strlen(pcVar1);
    std::__ostream_insert<char,std::char_traits<char>>(os,pcVar1,sVar3);
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,"_file \"${CMAKE_MATCH_3}\")\n",0x1a);
  IVar5.Level = IVar4.Level;
  if (-2 < indent.Level) {
    do {
      std::__ostream_insert<char,std::char_traits<char>>(os," ",1);
      IVar5.Level = IVar5.Level + -1;
    } while (IVar5.Level != 0);
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,"set(",4);
  pcVar1 = this->TmpVarPrefix;
  if (pcVar1 == (char *)0x0) {
    std::ios::clear(iVar2 + (int)os->_vptr_basic_ostream[-3]);
  }
  else {
    sVar3 = strlen(pcVar1);
    std::__ostream_insert<char,std::char_traits<char>>(os,pcVar1,sVar3);
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,"_path \"${",9);
  pcVar1 = this->TmpVarPrefix;
  if (pcVar1 == (char *)0x0) {
    std::ios::clear(iVar2 + (int)os->_vptr_basic_ostream[-3]);
  }
  else {
    sVar3 = strlen(pcVar1);
    std::__ostream_insert<char,std::char_traits<char>>(os,pcVar1,sVar3);
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,"_dir}${",7);
  pcVar1 = this->TmpVarPrefix;
  if (pcVar1 == (char *)0x0) {
    std::ios::clear(iVar2 + (int)os->_vptr_basic_ostream[-3]);
  }
  else {
    sVar3 = strlen(pcVar1);
    std::__ostream_insert<char,std::char_traits<char>>(os,pcVar1,sVar3);
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,"_name}\")\n",9);
  pcVar1 = this->TmpVarPrefix;
  local_a8._M_dataplus._M_p = (pointer)strlen(pcVar1);
  local_a8.field_2._M_allocated_capacity = 0;
  local_a8.field_2._8_8_ = 5;
  local_88 = "_path";
  local_80 = 0;
  views._M_len = 2;
  views._M_array = (iterator)&local_a8;
  local_a8._M_string_length = (size_type)pcVar1;
  cmCatViews(&local_c8,views);
  GetDestination(&local_a8,this,config);
  local_118._0_8_ = (pointer)0x0;
  local_118._8_8_ = (pointer)0x0;
  local_118._16_8_ = (pointer)0x0;
  cmInstallGenerator::AddInstallRule
            (&this->super_cmInstallGenerator,os,&local_a8,cmInstallType_DIRECTORY,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_118,false,(this->Permissions)._M_dataplus._M_p,(char *)0x0,(char *)0x0,
             " USE_SOURCE_PERMISSIONS",IVar4,local_c8._M_dataplus._M_p);
  local_f0 = evaluatedRPaths;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_118);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
  }
  local_a8._M_dataplus._M_p = (pointer)0x2;
  local_a8._M_string_length = 0x8d9813;
  local_a8.field_2._M_allocated_capacity = 0;
  pcVar1 = this->TmpVarPrefix;
  local_a8.field_2._8_8_ = strlen(pcVar1);
  local_80 = 0;
  local_78 = 9;
  local_70 = "_name}/${";
  local_68 = 0;
  local_88 = pcVar1;
  local_60 = strlen(pcVar1);
  local_50 = 0;
  local_48 = 6;
  local_40 = "_file}";
  local_38 = 0;
  views_00._M_len = 5;
  views_00._M_array = (iterator)&local_a8;
  local_58 = pcVar1;
  cmCatViews((string *)local_118,views_00);
  local_a8._M_dataplus._M_p = (pointer)0x2;
  local_a8._M_string_length = 0x8d9813;
  local_a8.field_2._M_allocated_capacity = 0;
  pcVar1 = this->TmpVarPrefix;
  local_a8.field_2._8_8_ = strlen(pcVar1);
  local_80 = 0;
  local_78 = 5;
  local_70 = "_dep}";
  local_68 = 0;
  views_01._M_len = 3;
  views_01._M_array = (iterator)&local_a8;
  local_88 = pcVar1;
  cmCatViews(&local_e8,views_01);
  GenerateInstallNameFixup(this,os,config,local_f0,&local_e8,(string *)local_118,IVar4);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
    operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
  }
  if (0 < indent.Level) {
    do {
      std::__ostream_insert<char,std::char_traits<char>>(os," ",1);
      indent.Level = indent.Level + -1;
    } while (indent.Level != 0);
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,"endif()\n",8);
  if ((pointer)local_118._0_8_ != (pointer)(local_118 + 0x10)) {
    operator_delete((void *)local_118._0_8_,(ulong)(local_118._16_8_ + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
    operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void cmInstallRuntimeDependencySetGenerator::GenerateAppleFrameworkScript(
  std::ostream& os, const std::string& config,
  const std::vector<std::string>& evaluatedRPaths, Indent indent)
{
  os << indent << "if(" << this->TmpVarPrefix
     << "_dep MATCHES \"^(.*/)?([^/]*\\\\.framework)/(.*)$\")\n"
     << indent.Next() << "set(" << this->TmpVarPrefix
     << "_dir \"${CMAKE_MATCH_1}\")\n"
     << indent.Next() << "set(" << this->TmpVarPrefix
     << "_name \"${CMAKE_MATCH_2}\")\n"
     << indent.Next() << "set(" << this->TmpVarPrefix
     << "_file \"${CMAKE_MATCH_3}\")\n"
     << indent.Next() << "set(" << this->TmpVarPrefix << "_path \"${"
     << this->TmpVarPrefix << "_dir}${" << this->TmpVarPrefix << "_name}\")\n";

  auto depName = cmStrCat(this->TmpVarPrefix, "_path");
  this->AddInstallRule(
    os, this->GetDestination(config), cmInstallType_DIRECTORY, {}, false,
    this->Permissions.c_str(), nullptr, nullptr, " USE_SOURCE_PERMISSIONS",
    indent.Next(), depName.c_str());

  auto depNameVar = cmStrCat("${", this->TmpVarPrefix, "_name}/${",
                             this->TmpVarPrefix, "_file}");
  this->GenerateInstallNameFixup(os, config, evaluatedRPaths,
                                 cmStrCat("${", this->TmpVarPrefix, "_dep}"),
                                 depNameVar, indent.Next());

  os << indent << "endif()\n";
}